

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O3

void __thiscall OpenMD::SimSnapshotManager::~SimSnapshotManager(SimSnapshotManager *this)

{
  Snapshot *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_SnapshotManager)._vptr_SnapshotManager =
       (_func_int **)&PTR__SimSnapshotManager_0033ab30;
  pSVar1 = (this->super_SnapshotManager).previousSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
  }
  operator_delete(pSVar1,0xa98);
  pSVar1 = (this->super_SnapshotManager).currentSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    p_Var2 = (pSVar1->frameData).spfData.
             super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    DataStorage::~DataStorage(&pSVar1->cgData);
    DataStorage::~DataStorage(&pSVar1->rigidbodyData);
    DataStorage::~DataStorage(&pSVar1->atomData);
  }
  operator_delete(pSVar1,0xa98);
  (this->super_SnapshotManager).currentSnapshot_ = (Snapshot *)0x0;
  (this->super_SnapshotManager).previousSnapshot_ = (Snapshot *)0x0;
  SnapshotManager::~SnapshotManager(&this->super_SnapshotManager);
  return;
}

Assistant:

SimSnapshotManager::~SimSnapshotManager() {
    delete previousSnapshot_;
    delete currentSnapshot_;
    previousSnapshot_ = NULL;
    currentSnapshot_  = NULL;
  }